

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::Reflection::UnsafeShallowSwapField
          (Reflection *this,Message *message1,Message *message2,FieldDescriptor *field)

{
  int iVar1;
  bool bVar2;
  RepeatedField<int> *this_00;
  RepeatedField<int> *other;
  RepeatedField<unsigned_long> *this_01;
  RepeatedField<unsigned_long> *other_00;
  RepeatedField<long> *this_02;
  RepeatedField<long> *other_01;
  RepeatedField<unsigned_int> *this_03;
  RepeatedField<unsigned_int> *other_02;
  RepeatedField<bool> *this_04;
  RepeatedField<bool> *other_03;
  RepeatedField<double> *this_05;
  RepeatedField<double> *other_04;
  RepeatedField<float> *this_06;
  RepeatedField<float> *other_05;
  LogMessage *this_07;
  CppType local_3c;
  LogMessage local_38;
  
  bVar2 = FieldDescriptor::is_repeated(field);
  iVar1 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4);
  if (bVar2) {
    switch(iVar1) {
    case 1:
    case 8:
      this_00 = MutableRaw<google::protobuf::RepeatedField<int>>(this,message1,field);
      other = MutableRaw<google::protobuf::RepeatedField<int>>(this,message2,field);
      RepeatedField<int>::InternalSwap(this_00,other);
      return;
    case 2:
      this_02 = MutableRaw<google::protobuf::RepeatedField<long>>(this,message1,field);
      other_01 = MutableRaw<google::protobuf::RepeatedField<long>>(this,message2,field);
      RepeatedField<long>::InternalSwap(this_02,other_01);
      return;
    case 3:
      this_03 = MutableRaw<google::protobuf::RepeatedField<unsigned_int>>(this,message1,field);
      other_02 = MutableRaw<google::protobuf::RepeatedField<unsigned_int>>(this,message2,field);
      RepeatedField<unsigned_int>::InternalSwap(this_03,other_02);
      return;
    case 4:
      this_01 = MutableRaw<google::protobuf::RepeatedField<unsigned_long>>(this,message1,field);
      other_00 = MutableRaw<google::protobuf::RepeatedField<unsigned_long>>(this,message2,field);
      RepeatedField<unsigned_long>::InternalSwap(this_01,other_00);
      return;
    case 5:
      this_05 = MutableRaw<google::protobuf::RepeatedField<double>>(this,message1,field);
      other_04 = MutableRaw<google::protobuf::RepeatedField<double>>(this,message2,field);
      RepeatedField<double>::InternalSwap(this_05,other_04);
      return;
    case 6:
      this_06 = MutableRaw<google::protobuf::RepeatedField<float>>(this,message1,field);
      other_05 = MutableRaw<google::protobuf::RepeatedField<float>>(this,message2,field);
      RepeatedField<float>::InternalSwap(this_06,other_05);
      return;
    case 7:
      this_04 = MutableRaw<google::protobuf::RepeatedField<bool>>(this,message1,field);
      other_03 = MutableRaw<google::protobuf::RepeatedField<bool>>(this,message2,field);
      RepeatedField<bool>::InternalSwap(this_04,other_03);
      return;
    case 9:
      internal::SwapFieldHelper::SwapRepeatedStringField<true>(this,message1,message2,field);
      return;
    case 10:
      internal::SwapFieldHelper::SwapRepeatedMessageField<true>(this,message1,message2,field);
      return;
    default:
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_38,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x3d3);
      this_07 = absl::lts_20250127::log_internal::LogMessage::operator<<
                          (&local_38,(char (*) [21])"Unimplemented type: ");
      local_3c = *(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4);
      absl::lts_20250127::log_internal::LogMessage::
      operator<<<google::protobuf::internal::FieldDescriptorLite::CppType,_0>(this_07,&local_3c);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_38);
    }
  }
  if (iVar1 != 9) {
    if (iVar1 != 10) {
      internal::SwapFieldHelper::SwapNonMessageNonStringField(this,message1,message2,field);
      return;
    }
    internal::SwapFieldHelper::SwapMessageField<true>(this,message1,message2,field);
    return;
  }
  internal::SwapFieldHelper::SwapStringField<true>(this,message1,message2,field);
  return;
}

Assistant:

void Reflection::UnsafeShallowSwapField(Message* message1, Message* message2,
                                        const FieldDescriptor* field) const {
  if (!field->is_repeated()) {
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      internal::SwapFieldHelper::SwapMessageField<true>(this, message1,
                                                        message2, field);
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
      internal::SwapFieldHelper::SwapStringField<true>(this, message1, message2,
                                                       field);
    } else {
      internal::SwapFieldHelper::SwapNonMessageNonStringField(this, message1,
                                                              message2, field);
    }
    return;
  }

  switch (field->cpp_type()) {
#define SHALLOW_SWAP_ARRAYS(CPPTYPE, TYPE)                                \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:                                \
    MutableRaw<RepeatedField<TYPE>>(message1, field)                      \
        ->InternalSwap(MutableRaw<RepeatedField<TYPE>>(message2, field)); \
    break;

    SHALLOW_SWAP_ARRAYS(INT32, int32_t);
    SHALLOW_SWAP_ARRAYS(INT64, int64_t);
    SHALLOW_SWAP_ARRAYS(UINT32, uint32_t);
    SHALLOW_SWAP_ARRAYS(UINT64, uint64_t);
    SHALLOW_SWAP_ARRAYS(FLOAT, float);
    SHALLOW_SWAP_ARRAYS(DOUBLE, double);
    SHALLOW_SWAP_ARRAYS(BOOL, bool);
    SHALLOW_SWAP_ARRAYS(ENUM, int);
#undef SHALLOW_SWAP_ARRAYS

    case FieldDescriptor::CPPTYPE_STRING:
      internal::SwapFieldHelper::SwapRepeatedStringField<true>(this, message1,
                                                               message2, field);
      break;
    case FieldDescriptor::CPPTYPE_MESSAGE:
      internal::SwapFieldHelper::SwapRepeatedMessageField<true>(
          this, message1, message2, field);
      break;

    default:
      ABSL_LOG(FATAL) << "Unimplemented type: " << field->cpp_type();
  }
}